

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this)

{
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
            (&this->super_TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>,
             &PTR_PTR_019b8100);
  (this->super_TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>).
  super_TPZAbstractFrontMatrix<float>.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZParFrontMatrix_019b7e78;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fStore = (TPZEqnArray<float> **)0x0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fStore = (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019c9a08;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<float>_*,_10>::Resize
            (&(this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>,0);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}